

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * callscrn_num_to_string
                 (char *string_buf,size_t string_buf_len,uint8_t *num_buf,size_t num_buf_len)

{
  char *pstr;
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  pcVar1 = string_buf + 1;
  sVar4 = 0;
  uVar2 = 1;
  do {
    if (num_buf_len == sVar4) break;
    pcVar1[-1] = ""[num_buf[sVar4] >> 4];
    if (string_buf_len - 1 <= uVar2) goto LAB_00104920;
    *pcVar1 = ""[num_buf[sVar4] & 0xf];
    sVar4 = sVar4 + 1;
    pcVar1 = pcVar1 + 2;
    uVar3 = uVar2 + 1;
    uVar2 = uVar2 + 2;
  } while (uVar3 < string_buf_len - 1);
  pcVar1 = pcVar1 + -1;
LAB_00104920:
  *pcVar1 = '\0';
  return string_buf;
}

Assistant:

char* callscrn_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        *pstr++ = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;
        *pstr++  = pn_lut[pn_digit];
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}